

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void __thiscall hwnet::sendContextPool::put(sendContextPool *this,sendContext *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)(this->pools + s->poolIndex);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    s->ptr = (char *)0x0;
    s->len = 0;
    s->next = (sendContext *)0x0;
    this_00 = (s->buff).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (__mutex[1].__data.__lock < 10000) {
      __mutex[1].__data.__lock = __mutex[1].__data.__lock + 1;
      if (*(long *)((long)__mutex + 0x30) != 0) {
        s->next = *(sendContext **)(*(long *)((long)__mutex + 0x30) + 0x20);
      }
      *(sendContext **)((long)__mutex + 0x30) = s;
    }
    else {
      free(s);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void put(TCPSocket::sendContext *s) {
		auto index = s->poolIndex;
		pool &p = this->pools[index]; 
		std::lock_guard<std::mutex> guard(p.mtx);
		s->~sendContext();		
		if(p.count < itemCount){
			p.count++;
			if(nullptr != p.head){
				s->next = p.head->next;
			}
			p.head = s;
		} else {
			free((void*)s);
		}
	}